

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testInit
          (VaryingLocationAliasingWithMixedTypesTest *this)

{
  bool bVar1;
  uint uVar2;
  GLuint GVar3;
  GLuint GVar4;
  uint uVar5;
  GLuint index;
  GLuint index_00;
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
  *this_00;
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
  *this_01;
  GLuint goten;
  uint uVar6;
  uint uVar7;
  STAGES SVar8;
  Type TVar9;
  Type TVar10;
  TYPES local_b0;
  value_type local_80;
  value_type local_58;
  
  this_00 = &this->m_test_cases;
  index_00 = 0;
  this_01 = this_00;
  do {
    if (index_00 == 0x22) {
      return;
    }
    TVar9 = TestBase::getType((TestBase *)this_01,index_00);
    GVar3 = TVar9.m_n_rows;
    if ((TVar9._0_8_ & 0xffffffff00000000) == 0x100000000) {
      for (index = 0; index != 0x22; index = index + 1) {
        local_b0 = TVar9.m_basic_type;
        TVar10 = TestBase::getType((TestBase *)this_01,index);
        GVar4 = TVar10.m_n_rows;
        if ((((TVar10._0_8_ & 0xffffffff00000000) == 0x100000000) &&
            (local_b0 < Int != TVar10.m_basic_type < Int)) && (GVar4 + GVar3 < 5)) {
          SVar8 = COMPUTE;
          do {
            if (SVar8 != COMPUTE) {
              if (SVar8 == STAGE_MAX) break;
              bVar1 = SVar8 != FRAGMENT || TVar10.m_basic_type != Double && local_b0 != Double;
              uVar5 = 0;
              uVar2 = -GVar4;
              while( true ) {
                uVar2 = uVar2 + 1;
                uVar7 = 0;
                if (0 < (int)uVar2) {
                  uVar7 = uVar2;
                }
                if (4 - GVar3 < uVar5) break;
                for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
                  local_58.m_is_input = true;
                  local_80.m_is_input = false;
                  this_01 = this_00;
                  local_80.m_component_gohan = uVar5;
                  local_80.m_component_goten = uVar6;
                  local_80.m_stage = SVar8;
                  local_80.m_type_goten = TVar10;
                  local_58.m_component_gohan = uVar5;
                  local_58.m_component_goten = uVar6;
                  local_58.m_stage = SVar8;
                  local_58.m_type_goten = TVar10;
                  local_80.m_type_gohan = TVar9;
                  local_58.m_type_gohan = TVar9;
                  std::
                  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                  ::push_back(this_00,&local_58);
                  if (bVar1) {
                    this_01 = this_00;
                    std::
                    vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                    ::push_back(this_00,&local_80);
                  }
                }
                for (uVar7 = uVar5 + GVar3; uVar7 <= 4 - GVar4; uVar7 = uVar7 + 1) {
                  local_58.m_is_input = true;
                  local_80.m_is_input = false;
                  this_01 = this_00;
                  local_80.m_component_gohan = uVar5;
                  local_80.m_component_goten = uVar7;
                  local_80.m_stage = SVar8;
                  local_80.m_type_goten = TVar10;
                  local_58.m_component_gohan = uVar5;
                  local_58.m_component_goten = uVar7;
                  local_58.m_stage = SVar8;
                  local_58.m_type_goten = TVar10;
                  local_80.m_type_gohan = TVar9;
                  local_58.m_type_gohan = TVar9;
                  std::
                  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                  ::push_back(this_00,&local_58);
                  if (bVar1) {
                    this_01 = this_00;
                    std::
                    vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
                    ::push_back(this_00,&local_80);
                  }
                }
                uVar5 = uVar5 + 1;
              }
            }
            SVar8 = SVar8 + VERTEX;
          } while( true );
        }
      }
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

void VaryingLocationAliasingWithMixedTypesTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip valid combinations */
			if (is_float_type_gohan == is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;
			const GLuint valid_component_gohan  = n_components_per_location - n_req_components_gohan;
			const GLuint valid_component_goten  = n_components_per_location - n_req_components_goten;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				/* Skip compute shader */
				if (Utils::Shader::COMPUTE == stage)
				{
					continue;
				}

				for (GLuint gohan = 0; gohan <= valid_component_gohan; ++gohan)
				{
					const GLint first_aliasing = gohan - n_req_components_goten + 1;
					const GLint last_aliasing  = gohan + n_req_components_gohan - 1;

					const GLuint goten_lower_limit = std::max(0, first_aliasing);
					const GLuint goten_upper_limit = last_aliasing + 1;

					/* Compoennets before gohan */
					for (GLuint goten = 0; goten < goten_lower_limit; ++goten)
					{
						testCase test_case_in = { gohan,	  goten,	 true, (Utils::Shader::STAGES)stage,
												  type_gohan, type_goten };
						testCase test_case_out = { gohan,	  goten,	 false, (Utils::Shader::STAGES)stage,
												   type_gohan, type_goten };

						m_test_cases.push_back(test_case_in);

						/* Skip double outputs in fragment shader */
						if ((Utils::Shader::FRAGMENT != stage) || ((Utils::Type::Double != type_gohan.m_basic_type) &&
																   (Utils::Type::Double != type_goten.m_basic_type)))
						{
							m_test_cases.push_back(test_case_out);
						}
					}

					/* Components after gohan */
					for (GLuint goten = goten_upper_limit; goten <= valid_component_goten; ++goten)
					{
						testCase test_case_in = { gohan,	  goten,	 true, (Utils::Shader::STAGES)stage,
												  type_gohan, type_goten };
						testCase test_case_out = { gohan,	  goten,	 false, (Utils::Shader::STAGES)stage,
												   type_gohan, type_goten };

						m_test_cases.push_back(test_case_in);

						/* Skip double outputs in fragment shader */
						if ((Utils::Shader::FRAGMENT != stage) || ((Utils::Type::Double != type_gohan.m_basic_type) &&
																   (Utils::Type::Double != type_goten.m_basic_type)))
						{
							m_test_cases.push_back(test_case_out);
						}
					}
				}
			}
		}
	}
}